

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O0

void __thiscall
InfoRecord::InfoRecord
          (InfoRecord *this,HighsInfoType Xtype,string *Xname,string *Xdescription,bool Xadvanced)

{
  string *in_RCX;
  string *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  byte in_R8B;
  
  *in_RDI = &PTR__InfoRecord_0096dbe8;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6));
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  std::__cxx11::string::operator=((string *)(in_RDI + 2),in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),in_RCX);
  *(byte *)(in_RDI + 10) = in_R8B & 1;
  return;
}

Assistant:

InfoRecord(HighsInfoType Xtype, std::string Xname, std::string Xdescription,
             bool Xadvanced) {
    this->type = Xtype;
    this->name = Xname;
    this->description = Xdescription;
    this->advanced = Xadvanced;
  }